

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_copy_from_window(lzh_stream *strm,lzh_dec *ds)

{
  size_t local_28;
  size_t copy_bytes;
  lzh_dec *ds_local;
  lzh_stream *strm_local;
  
  if ((ds->w_remaining == L'\0') && (L'\0' < ds->w_pos)) {
    if (strm->avail_out < (long)(ds->w_pos - ds->copy_pos)) {
      local_28 = strm->avail_out;
    }
    else {
      local_28 = (size_t)(ds->w_pos - ds->copy_pos);
    }
    memcpy(strm->next_out,ds->w_buff + ds->copy_pos,local_28);
    ds->copy_pos = (int)local_28 + ds->copy_pos;
  }
  else {
    if (strm->avail_out < (long)ds->w_remaining) {
      local_28 = strm->avail_out;
    }
    else {
      local_28 = (size_t)ds->w_remaining;
    }
    memcpy(strm->next_out,ds->w_buff + ((long)ds->w_size - (long)ds->w_remaining),local_28);
    ds->w_remaining = ds->w_remaining - (int)local_28;
  }
  strm->next_out = strm->next_out + local_28;
  strm->avail_out = strm->avail_out - local_28;
  strm->total_out = local_28 + strm->total_out;
  strm_local._4_4_ = (wchar_t)(strm->avail_out != 0);
  return strm_local._4_4_;
}

Assistant:

static int
lzh_copy_from_window(struct lzh_stream *strm, struct lzh_dec *ds)
{
	size_t copy_bytes;

	if (ds->w_remaining == 0 && ds->w_pos > 0) {
		if (ds->w_pos - ds->copy_pos <= strm->avail_out)
			copy_bytes = ds->w_pos - ds->copy_pos;
		else
			copy_bytes = (size_t)strm->avail_out;
		memcpy(strm->next_out,
		    ds->w_buff + ds->copy_pos, copy_bytes);
		ds->copy_pos += (int)copy_bytes;
	} else {
		if (ds->w_remaining <= strm->avail_out)
			copy_bytes = ds->w_remaining;
		else
			copy_bytes = (size_t)strm->avail_out;
		memcpy(strm->next_out,
		    ds->w_buff + ds->w_size - ds->w_remaining, copy_bytes);
		ds->w_remaining -= (int)copy_bytes;
	}
	strm->next_out += copy_bytes;
	strm->avail_out -= copy_bytes;
	strm->total_out += copy_bytes;
	if (strm->avail_out == 0)
		return (0);
	else
		return (1);
}